

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::create_object_implicitly
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  byte bVar1;
  semantic_tag sVar2;
  pointer phVar3;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_28;
  
  bVar1 = *(byte *)&this->field_0;
  phVar3 = (pointer)this;
  while ((bVar1 & 0xe) == 8) {
    phVar3 = (((anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
                *)&phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>)->byte_str_)
             .ptr_;
    bVar1 = (byte)(phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_;
  }
  sVar2 = *(undefined1 *)
           ((long)&(phVar3->super_heap_string_base<unsigned_long,_std::allocator<char>_>).extra_ + 1
           );
  local_28.long_str_.ptr_ = (pointer)operator_new(0x20);
  *(undefined8 *)
   &(((pointer)local_28.long_str_.ptr_)->
    super_heap_string_base<unsigned_long,_std::allocator<char>_>).field_0x8 = 0;
  ((pointer)local_28.long_str_.ptr_)->p_ = (pointer)0x0;
  (local_28.byte_str_.ptr_)->length_ = 0;
  local_28._0_1_ = 0xd;
  local_28.common_.tag_ = sVar2;
  operator=(this,(basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &local_28.common_);
  destroy((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&local_28.common_);
  return;
}

Assistant:

void create_object_implicitly(std::true_type)
        {
            *this = basic_json(json_object_arg, tag());
        }